

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

bool __thiscall FConfigFile::NextInSection(FConfigFile *this,char **key,char **value)

{
  FConfigEntry *pFVar1;
  FConfigEntry *entry;
  char **value_local;
  char **key_local;
  FConfigFile *this_local;
  
  pFVar1 = this->CurrentEntry;
  if (pFVar1 != (FConfigEntry *)0x0) {
    this->CurrentEntry = pFVar1->Next;
    *key = pFVar1->Key;
    *value = pFVar1->Value;
  }
  return pFVar1 != (FConfigEntry *)0x0;
}

Assistant:

bool FConfigFile::NextInSection (const char *&key, const char *&value)
{
	FConfigEntry *entry = CurrentEntry;

	if (entry == NULL)
		return false;

	CurrentEntry = entry->Next;
	key = entry->Key;
	value = entry->Value;
	return true;
}